

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.h
# Opt level: O0

Subscriber __thiscall
miniros::NodeHandle::subscribe<rosgraph_msgs::Log_<std::allocator<void>>,miniros::master::Rosout>
          (NodeHandle *this,string *topic,uint32_t queue_size,offset_in_Rosout_to_subr fp,
          Rosout *obj,TransportHints *transport_hints)

{
  undefined4 in_ECX;
  function<void_(const_std::shared_ptr<const_rosgraph_msgs::Log_<std::allocator<void>_>_>_&)>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SubscribeOptions *in_RSI;
  element_type *in_RDI;
  Subscriber SVar1;
  anon_class_24_2_75ef8c4f wrapFn;
  SubscribeOptions ops;
  TransportHints *in_stack_fffffffffffffe28;
  SubscribeOptions *in_stack_fffffffffffffe30;
  SubscribeOptions *this_00;
  undefined4 in_stack_fffffffffffffe38;
  uint32_t _queue_size;
  element_type *_topic;
  SubscribeOptions *this_01;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  
  _topic = in_RDI;
  this_01 = in_RSI;
  SubscribeOptions::SubscribeOptions(in_stack_fffffffffffffe30);
  _queue_size = (uint32_t)((ulong)in_RDI >> 0x20);
  std::function<void(std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>>const>const&)>::
  function<miniros::NodeHandle::subscribe<rosgraph_msgs::Log_<std::allocator<void>>,miniros::master::Rosout>(std::__cxx11::string_const&,unsigned_int,void(miniros::master::Rosout::*)(std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>>const>const&),miniros::master::Rosout*,miniros::TransportHints_const&)::_lambda(std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>>const>const&)_1_&,void>
            (in_RDX,(anon_class_24_2_75ef8c4f *)CONCAT44(in_ECX,in_stack_fffffffffffffe38));
  this_00 = (SubscribeOptions *)&stack0xfffffffffffffe78;
  std::function<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>>>()>::
  function<miniros::DefaultMessageCreator<rosgraph_msgs::Log_<std::allocator<void>>>,void>
            ((function<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_()> *)in_RDX,
             (DefaultMessageCreator<rosgraph_msgs::Log_<std::allocator<void>_>_> *)
             CONCAT44(in_ECX,in_stack_fffffffffffffe38));
  SubscribeOptions::init<rosgraph_msgs::Log_<std::allocator<void>>>
            (this_01,&_topic->topic_,_queue_size,
             (function<void_(const_std::shared_ptr<const_rosgraph_msgs::Log_<std::allocator<void>_>_>_&)>
              *)in_RSI,
             (function<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_()> *)in_RDX);
  master::std::function<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_()>::~function
            ((function<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_()> *)0x557b84);
  master::std::
  function<void_(const_std::shared_ptr<const_rosgraph_msgs::Log_<std::allocator<void>_>_>_&)>::
  ~function((function<void_(const_std::shared_ptr<const_rosgraph_msgs::Log_<std::allocator<void>_>_>_&)>
             *)0x557b91);
  TransportHints::operator=((TransportHints *)this_00,in_stack_fffffffffffffe28);
  subscribe((NodeHandle *)in_stack_fffffffffffffeb8,(SubscribeOptions *)in_stack_fffffffffffffeb0);
  SubscribeOptions::~SubscribeOptions(this_00);
  SVar1.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar1.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       _topic;
  return (Subscriber)
         SVar1.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Subscriber subscribe(const std::string& topic, uint32_t queue_size, 
                       void(T::*fp)(const std::shared_ptr<M const>&), T* obj, 
                       const TransportHints& transport_hints = TransportHints())
  {
    SubscribeOptions ops;
    auto wrapFn = [fp, obj](const std::shared_ptr<M const>& msg){(obj->*fp)(msg);};
    ops.template init<M>(topic, queue_size, wrapFn);
    ops.transport_hints = transport_hints;
    return subscribe(ops);
  }